

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.c
# Opt level: O0

LINK_HANDLE
link_create(SESSION_HANDLE session,char *name,role role,AMQP_VALUE source,AMQP_VALUE target)

{
  LOGGER_LOG p_Var1;
  AMQP_VALUE pAVar2;
  TICK_COUNTER_HANDLE pTVar3;
  SINGLYLINKEDLIST_HANDLE pSVar4;
  size_t sVar5;
  char *pcVar6;
  LINK_ENDPOINT_HANDLE pLVar7;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  size_t name_length;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  LOGGER_LOG l;
  LINK_INSTANCE *result;
  AMQP_VALUE target_local;
  AMQP_VALUE source_local;
  role role_local;
  char *name_local;
  SESSION_HANDLE session_local;
  
  l = (LOGGER_LOG)calloc(1,200);
  if ((LINK_INSTANCE *)l == (LINK_INSTANCE *)0x0) {
    p_Var1 = xlogging_get_log_function();
    if (p_Var1 != (LOGGER_LOG)0x0) {
      (*p_Var1)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                ,"link_create",0x2df,1,"Cannot create link");
    }
  }
  else {
    ((LINK_INSTANCE *)l)->link_state = LINK_STATE_DETACHED;
    ((LINK_INSTANCE *)l)->previous_link_state = LINK_STATE_DETACHED;
    ((LINK_INSTANCE *)l)->role = role;
    pAVar2 = amqpvalue_clone(source);
    ((LINK_INSTANCE *)l)->source = pAVar2;
    pAVar2 = amqpvalue_clone(target);
    ((LINK_INSTANCE *)l)->target = pAVar2;
    ((LINK_INSTANCE *)l)->session = session;
    ((LINK_INSTANCE *)l)->handle = 0;
    ((LINK_INSTANCE *)l)->snd_settle_mode = '\0';
    ((LINK_INSTANCE *)l)->rcv_settle_mode = '\0';
    ((LINK_INSTANCE *)l)->delivery_count = 0;
    ((LINK_INSTANCE *)l)->initial_delivery_count = 0;
    ((LINK_INSTANCE *)l)->max_message_size = 0;
    ((LINK_INSTANCE *)l)->max_link_credit = 10000;
    ((LINK_INSTANCE *)l)->peer_max_message_size = 0;
    ((LINK_INSTANCE *)l)->is_underlying_session_begun = false;
    ((LINK_INSTANCE *)l)->is_closed = false;
    ((LINK_INSTANCE *)l)->attach_properties = (fields)0x0;
    ((LINK_INSTANCE *)l)->received_payload = (uchar *)0x0;
    ((LINK_INSTANCE *)l)->received_payload_size = 0;
    ((LINK_INSTANCE *)l)->received_delivery_id = 0;
    (((LINK_INSTANCE *)l)->on_link_detach_received_event_subscription).on_link_detach_received =
         (ON_LINK_DETACH_RECEIVED)0x0;
    (((LINK_INSTANCE *)l)->on_link_detach_received_event_subscription).context = (void *)0x0;
    pTVar3 = tickcounter_create();
    ((LINK_INSTANCE *)l)->tick_counter = pTVar3;
    if (((LINK_INSTANCE *)l)->tick_counter == (TICK_COUNTER_HANDLE)0x0) {
      p_Var1 = xlogging_get_log_function();
      if (p_Var1 != (LOGGER_LOG)0x0) {
        (*p_Var1)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                  ,"link_create",0x2fd,1,"Cannot create tick counter for link");
      }
      free(l);
      l = (LOGGER_LOG)0x0;
    }
    else {
      pSVar4 = singlylinkedlist_create();
      ((LINK_INSTANCE *)l)->pending_deliveries = pSVar4;
      if (((LINK_INSTANCE *)l)->pending_deliveries == (SINGLYLINKEDLIST_HANDLE)0x0) {
        p_Var1 = xlogging_get_log_function();
        if (p_Var1 != (LOGGER_LOG)0x0) {
          (*p_Var1)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                    ,"link_create",0x306,1,"Cannot create pending deliveries list");
        }
        tickcounter_destroy(((LINK_INSTANCE *)l)->tick_counter);
        free(l);
        l = (LOGGER_LOG)0x0;
      }
      else {
        sVar5 = strlen(name);
        pcVar6 = (char *)malloc(sVar5 + 1);
        ((LINK_INSTANCE *)l)->name = pcVar6;
        if (((LINK_INSTANCE *)l)->name == (char *)0x0) {
          p_Var1 = xlogging_get_log_function();
          if (p_Var1 != (LOGGER_LOG)0x0) {
            (*p_Var1)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                      ,"link_create",0x311,1,"Cannot allocate memory for link name");
          }
          tickcounter_destroy(((LINK_INSTANCE *)l)->tick_counter);
          singlylinkedlist_destroy(((LINK_INSTANCE *)l)->pending_deliveries);
          free(l);
          l = (LOGGER_LOG)0x0;
        }
        else {
          ((LINK_INSTANCE *)l)->on_link_state_changed = (ON_LINK_STATE_CHANGED)0x0;
          ((LINK_INSTANCE *)l)->callback_context = (void *)0x0;
          set_link_state((LINK_INSTANCE *)l,LINK_STATE_DETACHED);
          memcpy(((LINK_INSTANCE *)l)->name,name,sVar5 + 1);
          pLVar7 = session_create_link_endpoint(session,name);
          ((LINK_INSTANCE *)l)->link_endpoint = pLVar7;
          if (((LINK_INSTANCE *)l)->link_endpoint == (LINK_ENDPOINT_HANDLE)0x0) {
            p_Var1 = xlogging_get_log_function();
            if (p_Var1 != (LOGGER_LOG)0x0) {
              (*p_Var1)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/uamqp/src/link.c"
                        ,"link_create",0x321,1,"Cannot create link endpoint");
            }
            tickcounter_destroy(((LINK_INSTANCE *)l)->tick_counter);
            singlylinkedlist_destroy(((LINK_INSTANCE *)l)->pending_deliveries);
            free(((LINK_INSTANCE *)l)->name);
            free(l);
            l = (LOGGER_LOG)0x0;
          }
          else {
            session_set_link_endpoint_callback
                      (((LINK_INSTANCE *)l)->link_endpoint,on_link_endpoint_destroyed,l);
          }
        }
      }
    }
  }
  return (LINK_HANDLE)l;
}

Assistant:

LINK_HANDLE link_create(SESSION_HANDLE session, const char* name, role role, AMQP_VALUE source, AMQP_VALUE target)
{
    LINK_INSTANCE* result = (LINK_INSTANCE*)calloc(1, sizeof(LINK_INSTANCE));
    if (result == NULL)
    {
        LogError("Cannot create link");
    }
    else
    {
        result->link_state = LINK_STATE_DETACHED;
        result->previous_link_state = LINK_STATE_DETACHED;
        result->role = role;
        result->source = amqpvalue_clone(source);
        result->target = amqpvalue_clone(target);
        result->session = session;
        result->handle = 0;
        result->snd_settle_mode = sender_settle_mode_unsettled;
        result->rcv_settle_mode = receiver_settle_mode_first;
        result->delivery_count = 0;
        result->initial_delivery_count = 0;
        result->max_message_size = 0;
        result->max_link_credit = DEFAULT_LINK_CREDIT;
        result->peer_max_message_size = 0;
        result->is_underlying_session_begun = false;
        result->is_closed = false;
        result->attach_properties = NULL;
        result->received_payload = NULL;
        result->received_payload_size = 0;
        result->received_delivery_id = 0;
        result->on_link_detach_received_event_subscription.on_link_detach_received = NULL;
        result->on_link_detach_received_event_subscription.context = NULL;

        result->tick_counter = tickcounter_create();
        if (result->tick_counter == NULL)
        {
            LogError("Cannot create tick counter for link");
            free(result);
            result = NULL;
        }
        else
        {
            result->pending_deliveries = singlylinkedlist_create();
            if (result->pending_deliveries == NULL)
            {
                LogError("Cannot create pending deliveries list");
                tickcounter_destroy(result->tick_counter);
                free(result);
                result = NULL;
            }
            else
            {
                size_t name_length = strlen(name);
                result->name = (char*)malloc(name_length + 1);
                if (result->name == NULL)
                {
                    LogError("Cannot allocate memory for link name");
                    tickcounter_destroy(result->tick_counter);
                    singlylinkedlist_destroy(result->pending_deliveries);
                    free(result);
                    result = NULL;
                }
                else
                {
                    result->on_link_state_changed = NULL;
                    result->callback_context = NULL;
                    set_link_state(result, LINK_STATE_DETACHED);

                    (void)memcpy(result->name, name, name_length + 1);
                    result->link_endpoint = session_create_link_endpoint(session, name);
                    if (result->link_endpoint == NULL)
                    {
                        LogError("Cannot create link endpoint");
                        tickcounter_destroy(result->tick_counter);
                        singlylinkedlist_destroy(result->pending_deliveries);
                        free(result->name);
                        free(result);
                        result = NULL;
                    }
                    else
                    {
                        // This ensures link.c gets notified if the link endpoint is destroyed
                        // by uamqp (due to a DETACH from the hub, e.g.) to prevent a double free.
                        session_set_link_endpoint_callback(result->link_endpoint, on_link_endpoint_destroyed, result);
                    }
                }
            }
        }
    }

    return result;
}